

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

TimerHolder __thiscall Liby::TimerQueue::insert(TimerQueue *this,Timer *timer)

{
  _Atomic_word *p_Var1;
  BasicHandler *pBVar2;
  int iVar3;
  Logger *this_00;
  undefined8 *puVar4;
  Timer *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  double __x;
  TimerHolder TVar6;
  WeakTimerHolder weak_holder;
  WeakTimerHolder local_68;
  
  this_00 = Logger::getLogger();
  Logger::log(this_00,__x);
  if (in_RDX->id_ != 0) {
    if (*(int *)&(timer->handler_).super__Function_base._M_manager == 0) {
      updateTimerfd((TimerQueue *)timer,&in_RDX->timeout_);
    }
    *(undefined8 *)this = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Timer,std::allocator<Liby::Timer>,Liby::Timer_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->timerfp_,(Timer **)this,
               (allocator<Liby::Timer> *)&local_68,in_RDX);
    WeakTimerHolder::WeakTimerHolder(&local_68,(TimerHolder *)this);
    BinaryHeap<Liby::WeakTimerHolder>::insert
              ((BinaryHeap<Liby::WeakTimerHolder> *)
               &(timer->handler_).super__Function_base._M_manager,&local_68);
    _Var5._M_pi = extraout_RDX;
    if (local_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_68.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        _Var5._M_pi = extraout_RDX_00;
      }
    }
    if (local_68.timer_.handler_.super__Function_base._M_manager != (_Manager_type)0x0) {
      pBVar2 = &local_68.timer_.handler_;
      (*local_68.timer_.handler_.super__Function_base._M_manager)
                ((_Any_data *)pBVar2,(_Any_data *)pBVar2,__destroy_functor);
      _Var5._M_pi = extraout_RDX_01;
    }
    TVar6.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    TVar6.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (TimerHolder)TVar6.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "timer id will not be zero";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

TimerHolder TimerQueue::insert(const Timer &timer) {
    verbose("add timer id = %lu", timer.id());
    if (timer.id() == 0) // ignore all timer which id is zero
        throw "timer id will not be zero";

    if (queue_.empty()) {
        updateTimerfd(timer.timeout());
    }

    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    queue_.insert(weak_holder);
    return holder;
}